

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::ContentEncoding::EncryptionSize(ContentEncoding *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  uint64 uVar3;
  
  uVar1 = ContentEncAESSettings::Size(&this->enc_aes_settings_);
  uVar2 = EbmlElementSize(0x47e2,this->enc_key_id_,this->enc_key_id_length_);
  uVar3 = EbmlElementSize(0x47e1,this->enc_algo_);
  return uVar3 + uVar2 + uVar1;
}

Assistant:

uint64_t ContentEncoding::EncryptionSize() const {
  const uint64_t aes_size = enc_aes_settings_.Size();

  uint64_t encryption_size = EbmlElementSize(libwebm::kMkvContentEncKeyID,
                                             enc_key_id_, enc_key_id_length_);
  encryption_size += EbmlElementSize(libwebm::kMkvContentEncAlgo,
                                     static_cast<uint64>(enc_algo_));

  return encryption_size + aes_size;
}